

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

void __thiscall
iDynTree::KinDynComputations::computeRawMassMatrixAndTotalMomentum(KinDynComputations *this)

{
  KinDynComputationsPrivateAttributes *pKVar1;
  bool bVar2;
  JointPosDoubleArray *pJVar3;
  
  pKVar1 = this->pimpl;
  if (pKVar1->m_isRawMassMatrixUpdated == false) {
    pJVar3 = (JointPosDoubleArray *)iDynTree::FreeFloatingPos::jointPos();
    bVar2 = (bool)iDynTree::CompositeRigidBodyAlgorithm
                            (&pKVar1->m_robot_model,&pKVar1->m_traversal,pJVar3,
                             &this->pimpl->m_linkCRBIs,&this->pimpl->m_rawMassMatrix);
    iDynTree::reportErrorIf
              ((bool)(bVar2 ^ 1),"KinDynComputations::computeRawMassMatrix",
               "Error in computing mass matrix.");
    computeFwdKinematics(this);
    pKVar1 = this->pimpl;
    iDynTree::ComputeLinearAndAngularMomentum
              (&pKVar1->m_robot_model,&pKVar1->m_linkPos,&pKVar1->m_linkVel,&pKVar1->m_totalMomentum
              );
    this->pimpl->m_isRawMassMatrixUpdated = bVar2;
  }
  return;
}

Assistant:

void KinDynComputations::computeRawMassMatrixAndTotalMomentum()
{
    if( this->pimpl->m_isRawMassMatrixUpdated )
    {
        return;
    }

    // Compute raw mass matrix
    bool ok = CompositeRigidBodyAlgorithm(pimpl->m_robot_model,
                                          pimpl->m_traversal,
                                          pimpl->m_pos.jointPos(),
                                          pimpl->m_linkCRBIs,
                                          pimpl->m_rawMassMatrix);

    reportErrorIf(!ok,"KinDynComputations::computeRawMassMatrix","Error in computing mass matrix.");


    // m_linkPos and m_linkVel are used in the computation of the total momentum
    // so we need to make sure that they are updated
    this->computeFwdKinematics();

    // Compute total momentum
    ComputeLinearAndAngularMomentum(pimpl->m_robot_model,
                                    pimpl->m_linkPos,
                                    pimpl->m_linkVel,
                                    pimpl->m_totalMomentum);

    this->pimpl->m_isRawMassMatrixUpdated = ok;
}